

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

PCMSegment *
Storage::Encodings::AppleGCR::five_and_three_data
          (PCMSegment *__return_storage_ptr__,uint8_t *source)

{
  value_type vVar1;
  reference pvVar2;
  byte *pbVar3;
  ulong local_50;
  size_t c;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint8_t *source_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = source;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x1a1,&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  *pvVar2 = 0xd5;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,1);
  *pvVar2 = 0xaa;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,2);
  *pvVar2 = 0xad;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x19e);
  *pvVar2 = 0xde;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x19b);
  *pvVar2 = 0xaa;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x1a0);
  *pvVar2 = 0xeb;
  for (local_50 = 0; local_50 < 0x19a; local_50 = local_50 + 1) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                        local_50 + 3);
    vVar1 = (anonymous_namespace)::five_and_three_mapping[*pbVar3];
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                        local_50 + 3);
    *pvVar2 = vVar1;
  }
  Disk::PCMSegment::PCMSegment
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::five_and_three_data(const uint8_t *source) {
	std::vector<uint8_t> data(410 + 7);

	data[0] = data_prologue[0];
	data[1] = data_prologue[1];
	data[2] = data_prologue[2];

	data[414] = epilogue[0];
	data[411] = epilogue[1];
	data[416] = epilogue[2];

	// TODO: encode.
	(void)source;

//	std::size_t source_pointer = 0;
//	std::size_t destination_pointer = 3;
//	while(source_pointer < 255) {
//		encode_five_and_three_block(&segment.data[destination_pointer], &source[source_pointer]);
//
//		source_pointer += 5;
//		destination_pointer += 8;
//	}

	// Map five-bit values up to full bytes.
	for(std::size_t c = 0; c < 410; ++c) {
		data[3 + c] = five_and_three_mapping[data[3 + c]];
	}

	return Storage::Disk::PCMSegment(data);
}